

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

void __thiscall Args::CmdLine::parse(CmdLine *this)

{
  ulong uVar1;
  pointer *pppCVar2;
  pointer pcVar3;
  pointer ppCVar4;
  Command *pCVar5;
  iterator iVar6;
  size_type sVar7;
  size_type sVar8;
  char cVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined8 uVar12;
  iterator iVar13;
  long lVar14;
  undefined8 *puVar15;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var16;
  ArgIface *pAVar17;
  logic_error *plVar18;
  long *plVar19;
  size_type *psVar20;
  ulong *puVar21;
  byte bVar22;
  bool bVar23;
  _Alloc_hider _Var24;
  pointer ppCVar25;
  ulong uVar26;
  String value;
  String word;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> tmpArgs;
  ArgIface *tmp;
  ArgIface *arg;
  anon_class_24_3_c2b40766 check;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  value_type local_160;
  String local_140;
  undefined8 local_120;
  Context *local_118;
  long local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ulong *local_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Command **local_c8;
  ArgIface *local_c0;
  vector<Args::Command*,std::allocator<Args::Command*>> *local_b8;
  Command **local_b0;
  ulong *local_a8;
  long local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_class_24_3_c2b40766 local_48;
  
  clear(this);
  checkCorrectnessBeforeParsing(this);
  pbVar11 = (this->m_context).m_it._M_current;
  if (pbVar11 !=
      (this->m_context).m_context.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_118 = &this->m_context;
    local_b8 = (vector<Args::Command*,std::allocator<Args::Command*>> *)&this->m_prevCommand;
    local_c8 = &this->m_command;
    local_b0 = &this->m_currCommand;
    do {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      (this->m_context).m_it._M_current = pbVar11 + 1;
      pcVar3 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar3,pcVar3 + pbVar11->_M_string_length);
      cVar9 = (char)&local_140;
      local_110 = std::__cxx11::string::find(cVar9,0x3d);
      if (local_110 == -1) {
        local_120 = 0;
      }
      else {
        uVar12 = std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_140);
        local_120 = CONCAT71((int7)((ulong)uVar12 >> 8),local_160._M_string_length != 0);
        if (local_160._M_string_length != 0) {
          iVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&local_118->m_context,(this->m_context).m_it._M_current,&local_160);
          (this->m_context).m_it._M_current = iVar13._M_current;
        }
        std::__cxx11::string::substr((ulong)&local_1a0,(ulong)&local_140);
        std::__cxx11::string::operator=((string *)&local_140,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      lVar14 = std::__cxx11::string::find((char *)&local_140,0x1274bb,0);
      if (lVar14 == 0) {
        pAVar17 = findArgument(this,&local_140);
        if (pAVar17 == (ArgIface *)0x0) {
          if ((this->m_opt & 2) == 0) {
            printInfoAboutUnknownArgument(this,&local_140);
          }
          else {
            savePositionalArguments(this,&local_140,local_110 != -1,local_120._0_1_);
          }
        }
        else {
          (*pAVar17->_vptr_ArgIface[0xf])(pAVar17,local_118);
        }
      }
      else {
        lVar14 = std::__cxx11::string::find((char *)&local_140,0x1274bb,0);
        if ((lVar14 == 0) ||
           (lVar14 = std::__cxx11::string::find(cVar9,0x2d), sVar7 = local_140._M_string_length,
           lVar14 != 0)) {
          local_c0 = findArgument(this,&local_140);
          local_48.tmp = &local_c0;
          local_48.this = this;
          local_48.word = &local_140;
          if ((local_c0 == (ArgIface *)0x0) ||
             (iVar10 = (*local_c0->_vptr_ArgIface[2])(local_c0), iVar10 != 0)) {
            if ((this->m_opt & 2) == 0) {
              printInfoAboutUnknownArgument(this,&local_140);
            }
            else {
              savePositionalArguments(this,&local_140,local_110 != -1,local_120._0_1_);
            }
          }
          else {
            ppCVar4 = (this->m_prevCommand).
                      super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (ppCVar25 = (this->m_prevCommand).
                            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_start; ppCVar25 != ppCVar4;
                ppCVar25 = ppCVar25 + 1) {
              pCVar5 = *ppCVar25;
              _Var16 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_pred<Args::CmdLine::parse()::_lambda(auto:1_const&)_1_>>
                                 (*(undefined8 *)(pCVar5 + 0x10),*(undefined8 *)(pCVar5 + 0x18),
                                  &local_c0);
              if ((_Var16._M_current !=
                   *(unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> **)
                    (pCVar5 + 0x18)) &&
                 (pAVar17 = Command::findChild(this->m_currCommand,&local_140),
                 pAVar17 == (ArgIface *)0x0)) {
                plVar18 = (logic_error *)__cxa_allocate_exception(0x30);
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_108,
                           "Only one command from one level can be specified. But you defined \"",""
                          );
                std::operator+(&local_180,&local_108,&local_140);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_180);
                local_1a0._M_dataplus._M_p = (pointer)*plVar19;
                psVar20 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_1a0._M_dataplus._M_p == psVar20) {
                  local_1a0.field_2._M_allocated_capacity = *psVar20;
                  local_1a0.field_2._8_4_ = (undefined4)plVar19[3];
                  local_1a0.field_2._12_4_ = *(undefined4 *)((long)plVar19 + 0x1c);
                  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
                }
                else {
                  local_1a0.field_2._M_allocated_capacity = *psVar20;
                }
                local_1a0._M_string_length = plVar19[1];
                *plVar19 = (long)psVar20;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                (**(code **)(*(long *)*ppCVar25 + 0x18))(&local_68);
                std::operator+(&local_160,&local_1a0,&local_68);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_160);
                local_e8 = (ulong *)*plVar19;
                puVar21 = (ulong *)(plVar19 + 2);
                if (local_e8 == puVar21) {
                  local_d8 = *puVar21;
                  uStack_d0 = plVar19[3];
                  local_e8 = &local_d8;
                }
                else {
                  local_d8 = *puVar21;
                }
                local_e0 = plVar19[1];
                *plVar19 = (long)puVar21;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::logic_error::logic_error(plVar18,"Please use desc() method of the exception.");
                *(undefined ***)plVar18 = &PTR__BaseException_00133c60;
                *(logic_error **)(plVar18 + 0x10) = plVar18 + 0x20;
                if (local_e8 == &local_d8) {
                  *(undefined4 *)(plVar18 + 0x20) = (undefined4)local_d8;
                  *(undefined4 *)(plVar18 + 0x24) = local_d8._4_4_;
                  *(undefined4 *)(plVar18 + 0x28) = (undefined4)uStack_d0;
                  *(undefined4 *)(plVar18 + 0x2c) = uStack_d0._4_4_;
                }
                else {
                  *(ulong **)(plVar18 + 0x10) = local_e8;
                  *(ulong *)(plVar18 + 0x20) = local_d8;
                }
                *(long *)(plVar18 + 0x18) = local_e0;
                local_e8 = &local_d8;
                local_e0 = 0;
                local_d8 = local_d8 & 0xffffffffffffff00;
                __cxa_throw(plVar18,&BaseException::typeinfo,BaseException::~BaseException);
              }
            }
            parse::anon_class_24_3_c2b40766::operator()(&local_48);
            if (*local_c8 == (Command *)0x0) {
              this->m_command = (Command *)local_c0;
              this->m_currCommand = (Command *)local_c0;
              iVar6._M_current =
                   (this->m_prevCommand).
                   super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->m_prevCommand).
                  super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Args::Command*,std::allocator<Args::Command*>>::
                _M_realloc_insert<Args::Command*const&>(local_b8,iVar6,local_c8);
              }
              else {
                *iVar6._M_current = (Command *)local_c0;
                pppCVar2 = &(this->m_prevCommand).
                            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppCVar2 = *pppCVar2 + 1;
              }
              (**(code **)(*(long *)*local_c8 + 0x78))(*local_c8,local_118);
            }
            else {
              *(ArgIface **)(this->m_currCommand + 0xe8) = local_c0;
              this->m_currCommand = (Command *)local_c0;
              iVar6._M_current =
                   (this->m_prevCommand).
                   super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->m_prevCommand).
                  super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Args::Command*,std::allocator<Args::Command*>>::
                _M_realloc_insert<Args::Command*const&>(local_b8,iVar6,local_b0);
              }
              else {
                *iVar6._M_current = (Command *)local_c0;
                pppCVar2 = &(this->m_prevCommand).
                            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppCVar2 = *pppCVar2 + 1;
              }
              (**(code **)(*(long *)*local_b0 + 0x78))(*local_b0,local_118);
            }
          }
        }
        else {
          local_108._M_dataplus._M_p = (pointer)0x0;
          local_108._M_string_length = 0;
          local_108.field_2._M_allocated_capacity = 0;
          if (1 < local_140._M_string_length) {
            uVar1 = local_140._M_string_length - 1;
            uVar26 = 1;
            bVar23 = false;
            do {
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"-","");
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_180,'\x01');
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                uVar12 = local_1a0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_180._M_string_length + local_1a0._M_string_length) {
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  uVar12 = local_180.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_180._M_string_length + local_1a0._M_string_length)
                goto LAB_0011e96a;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_180,0,(char *)0x0,
                                     (ulong)local_1a0._M_dataplus._M_p);
              }
              else {
LAB_0011e96a:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_1a0,(ulong)local_180._M_dataplus._M_p);
              }
              psVar20 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar20) {
                local_160.field_2._M_allocated_capacity = *psVar20;
                local_160.field_2._8_8_ = puVar15[3];
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar20;
                local_160._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_160._M_string_length = puVar15[1];
              *puVar15 = psVar20;
              puVar15[1] = 0;
              *(undefined1 *)psVar20 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              local_68._M_dataplus._M_p = (pointer)findArgument(this,&local_160);
              if ((ArgIface *)local_68._M_dataplus._M_p == (ArgIface *)0x0) {
                if ((this->m_opt & 2) == 0) {
                  plVar18 = (logic_error *)__cxa_allocate_exception(0x30);
                  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_180,"Unknown argument \"","");
                  std::operator+(&local_1a0,&local_180,&local_160);
                  plVar19 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                  local_88 = (ulong *)*plVar19;
                  puVar21 = (ulong *)(plVar19 + 2);
                  if (local_88 == puVar21) {
                    local_78 = *puVar21;
                    uStack_70 = plVar19[3];
                    local_88 = &local_78;
                  }
                  else {
                    local_78 = *puVar21;
                  }
                  local_80 = plVar19[1];
                  *plVar19 = (long)puVar21;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  std::logic_error::logic_error
                            (plVar18,"Please use desc() method of the exception.");
                  *(undefined ***)plVar18 = &PTR__BaseException_00133c60;
                  *(logic_error **)(plVar18 + 0x10) = plVar18 + 0x20;
                  if (local_88 == &local_78) {
                    *(undefined4 *)(plVar18 + 0x20) = (undefined4)local_78;
                    *(undefined4 *)(plVar18 + 0x24) = local_78._4_4_;
                    *(undefined4 *)(plVar18 + 0x28) = (undefined4)uStack_70;
                    *(undefined4 *)(plVar18 + 0x2c) = uStack_70._4_4_;
                  }
                  else {
                    *(ulong **)(plVar18 + 0x10) = local_88;
                    *(ulong *)(plVar18 + 0x20) = local_78;
                  }
                  *(long *)(plVar18 + 0x18) = local_80;
                  local_80 = 0;
                  local_78 = local_78 & 0xffffffffffffff00;
                  local_88 = &local_78;
                  __cxa_throw(plVar18,&BaseException::typeinfo,BaseException::~BaseException);
                }
LAB_0011ea80:
                bVar23 = true;
                bVar22 = 0;
              }
              else {
                if (local_108._M_string_length == local_108.field_2._M_allocated_capacity) {
                  std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>::
                  _M_realloc_insert<Args::ArgIface*const&>
                            ((vector<Args::ArgIface*,std::allocator<Args::ArgIface*>> *)&local_108,
                             (iterator)local_108._M_string_length,(ArgIface **)&local_68);
                }
                else {
                  *(pointer *)local_108._M_string_length = local_68._M_dataplus._M_p;
                  local_108._M_string_length = local_108._M_string_length + 8;
                }
                if ((uVar26 < uVar1) &&
                   (cVar9 = (**(code **)(*(long *)local_68._M_dataplus._M_p + 0x20))(),
                   cVar9 != '\0')) {
                  if ((this->m_opt & 2) == 0) {
                    plVar18 = (logic_error *)__cxa_allocate_exception(0x30);
                    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_180,
                               "Only last argument in flags combo can be with value. Flags combo is \""
                               ,"");
                    std::operator+(&local_1a0,&local_180,&local_140);
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1a0);
                    local_a8 = (ulong *)*plVar19;
                    puVar21 = (ulong *)(plVar19 + 2);
                    if (local_a8 == puVar21) {
                      local_98 = *puVar21;
                      uStack_90 = plVar19[3];
                      local_a8 = &local_98;
                    }
                    else {
                      local_98 = *puVar21;
                    }
                    local_a0 = plVar19[1];
                    *plVar19 = (long)puVar21;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    std::logic_error::logic_error
                              (plVar18,"Please use desc() method of the exception.");
                    *(undefined ***)plVar18 = &PTR__BaseException_00133c60;
                    *(logic_error **)(plVar18 + 0x10) = plVar18 + 0x20;
                    if (local_a8 == &local_98) {
                      *(undefined4 *)(plVar18 + 0x20) = (undefined4)local_98;
                      *(undefined4 *)(plVar18 + 0x24) = local_98._4_4_;
                      *(undefined4 *)(plVar18 + 0x28) = (undefined4)uStack_90;
                      *(undefined4 *)(plVar18 + 0x2c) = uStack_90._4_4_;
                    }
                    else {
                      *(ulong **)(plVar18 + 0x10) = local_a8;
                      *(ulong *)(plVar18 + 0x20) = local_98;
                    }
                    *(long *)(plVar18 + 0x18) = local_a0;
                    local_a0 = 0;
                    local_98 = local_98 & 0xffffffffffffff00;
                    local_a8 = &local_98;
                    __cxa_throw(plVar18,&BaseException::typeinfo,BaseException::~BaseException);
                  }
                  goto LAB_0011ea80;
                }
                bVar22 = 1;
                (**(code **)(*(long *)local_68._M_dataplus._M_p + 0x78))
                          (local_68._M_dataplus._M_p,local_118);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              sVar8 = local_108._M_string_length;
              uVar26 = uVar26 + 1;
            } while ((bool)(bVar22 & uVar26 < sVar7));
            if ((bVar23) && (_Var24._M_p = local_108._M_dataplus._M_p, (this->m_opt & 2) != 0)) {
              for (; _Var24._M_p != (pointer)sVar8; _Var24._M_p = (pointer)((long)_Var24._M_p + 8))
              {
                (*(*(ArgIface **)_Var24._M_p)->_vptr_ArgIface[0xd])();
              }
              savePositionalArguments(this,&local_140,local_110 != -1,local_120._0_1_);
            }
          }
          if ((ArgIface **)local_108._M_dataplus._M_p != (ArgIface **)0x0) {
            operator_delete(local_108._M_dataplus._M_p,
                            local_108.field_2._M_allocated_capacity -
                            (long)local_108._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pbVar11 = (this->m_context).m_it._M_current;
    } while (pbVar11 !=
             (this->m_context).m_context.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  checkCorrectnessAfterParsing(this);
  return;
}

Assistant:

inline void
CmdLine::parse()
{
	clear();

	checkCorrectnessBeforeParsing();

	while( !m_context.atEnd() )
	{
		String word = *m_context.next();

		const String::size_type eqIt = word.find( '=' );

		bool splitted = false;
		bool valuePrepended = false;

		if( eqIt != String::npos )
		{
			splitted = true;

			const String value = word.substr( eqIt + 1 );

			if( !value.empty() )
			{
				valuePrepended = true;
				m_context.prepend( value );
			}

			word = word.substr( 0, eqIt );
		}

		if( details::isArgument( word ) )
		{
			auto * arg = findArgument( word );

			if( arg )
				arg->process( m_context );
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
		else if( details::isFlag( word ) )
		{
			std::vector< ArgIface* > tmpArgs;
			bool failed = false;

			for( String::size_type i = 1, length = word.length(); i < length; ++i )
			{
				const String flag = String( SL( "-" ) ) +

#ifdef ARGS_QSTRING_BUILD
					String( word[ i ] );
#else
					String( 1, word[ i ] );
#endif

				auto * arg = findArgument( flag );

				if( !arg )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Unknown argument \"" ) ) +
							flag + SL( "\"." ) );
					else
						break;
				}
				else
					tmpArgs.push_back( arg );

				if( i < length - 1 && arg->isWithValue() )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Only last argument in "
							"flags combo can be with value. Flags combo is \"" ) ) +
							word + SL( "\"." ) );
					else
						break;
				}
				else
					arg->process( m_context );
			}

			if( failed && ( m_opt & HandlePositionalArguments ) )
			{
				for( auto * a : tmpArgs )
					a->clear();

				savePositionalArguments( word, splitted, valuePrepended );
			}
		}
		// Command?
		else
		{
			auto * tmp = findArgument( word );

			auto check = [this, &tmp, &word] ()
			{
				const auto & args = m_args;

				const auto it = std::find_if( args.cbegin(),
					args.cend(), [&tmp] ( const auto & arg ) -> bool
						{ return ( arg.get() == tmp ); } );

				if( m_command && it != args.cend() && !m_command->findChild( word ) )
					throw BaseException( String( SL(
							"Only one command from one level can be specified. "
							"But you defined \"" ) ) +
						word + SL( "\" and \"" ) + m_command->name() + SL( "\"." ) );
			};

			if( tmp )
			{
				if( tmp->type() == ArgType::Command )
				{
					bool stopProcessing = false;

					try {
						if( !m_prevCommand.empty() )
						{
							for( const auto & prev : m_prevCommand )
							{
								const auto & args = prev->children();

								const auto it = std::find_if( args.cbegin(),
									args.cend(), [&tmp] ( const auto & arg ) -> bool
										{ return ( arg.get() == tmp ); } );

								if( it != args.cend() && !m_currCommand->findChild( word ) )
									throw BaseException( String( SL(
											"Only one command from one level can be specified. "
											"But you defined \"" ) ) +
										word + SL( "\" and \"" ) + prev->name() + SL( "\"." ) );
							}

							check();
						}
						else
							check();
					}
					catch( const BaseException & )
					{
						if( m_opt & HandlePositionalArguments )
						{
							savePositionalArguments( word, splitted, valuePrepended );

							stopProcessing = true;
						}
						else
							throw;
					}

					if( stopProcessing )
						continue;

					if( !m_command )
					{
						m_command = static_cast< Command* > ( tmp );

						m_currCommand = m_command;

						m_prevCommand.push_back( m_command );

						m_command->process( m_context );
					}
					else
					{
						auto * cmd = static_cast< Command* > ( tmp );

						m_currCommand->setCurrentSubCommand( cmd );

						m_currCommand = cmd;

						m_prevCommand.push_back( m_currCommand );

						m_currCommand->process( m_context );
					}
				}
				else if( m_opt & HandlePositionalArguments )
					savePositionalArguments( word, splitted, valuePrepended );
				else
					printInfoAboutUnknownArgument( word );
			}
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
	}

	checkCorrectnessAfterParsing();
}